

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ValueHolder *
testing::internal::
CheckedDowncastToActualType<testing::internal::ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder,testing::internal::ThreadLocalValueHolderBase>
          (ThreadLocalValueHolderBase *base)

{
  bool bVar1;
  ostream *poVar2;
  ValueHolder *in_RDI;
  int in_stack_0000003c;
  char *in_stack_00000040;
  GTestLogSeverity in_stack_0000004c;
  GTestLog *in_stack_00000050;
  GTestLog *in_stack_ffffffffffffffd0;
  bool local_1d;
  GTestLog local_c;
  ValueHolder *local_8;
  
  local_1d = true;
  local_8 = in_RDI;
  if (in_RDI != (ValueHolder *)0x0) {
    if (in_RDI == (ValueHolder *)0x0) {
      in_stack_ffffffffffffffd0 = (GTestLog *)0x0;
    }
    else {
      in_stack_ffffffffffffffd0 =
           (GTestLog *)
           __dynamic_cast(in_RDI,&ThreadLocalValueHolderBase::typeinfo,
                          &ThreadLocal<testing::TestPartResultReporterInterface*>::ValueHolder::
                           typeinfo,0);
    }
    local_1d = in_stack_ffffffffffffffd0 != (GTestLog *)0x0;
  }
  bVar1 = IsTrue(local_1d);
  if (!bVar1) {
    GTestLog::GTestLog(in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c);
    poVar2 = GTestLog::GetStream(&local_c);
    std::operator<<(poVar2,
                    "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ")
    ;
    GTestLog::~GTestLog(in_stack_ffffffffffffffd0);
  }
  return local_8;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
  static_assert(std::is_base_of<Base, Derived>::value,
                "target type not derived from source type");
#if GTEST_HAS_RTTI
  GTEST_CHECK_(base == nullptr || dynamic_cast<Derived*>(base) != nullptr);
#endif
  return static_cast<Derived*>(base);
}